

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

ES5ArrayTypeHandlerBase<unsigned_short> * __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
ConvertToES5ArrayType
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this,
          DynamicObject *instance)

{
  ES5ArrayTypeHandlerBase<unsigned_short> *pEVar1;
  ScriptContext *pSVar2;
  ES5ArrayTypeHandlerBase<unsigned_short> *newTypeHandler;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this_local;
  
  pEVar1 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
           ConvertToTypeHandler<Js::ES5ArrayTypeHandlerBase<unsigned_short>,Js::PropertyRecord_const*>
                     ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>
                       *)this,instance);
  pSVar2 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  pSVar2->convertSimpleDictionaryToDictionaryCount =
       pSVar2->convertSimpleDictionaryToDictionaryCount + 1;
  return pEVar1;
}

Assistant:

ES5ArrayTypeHandlerBase<TPropertyIndex>* SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToES5ArrayType(DynamicObject* instance)
    {
        ES5ArrayTypeHandlerBase<TPropertyIndex>* newTypeHandler = ConvertToTypeHandler<ES5ArrayTypeHandlerBase<TPropertyIndex>, const PropertyRecord*>(instance);

#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertSimpleDictionaryToDictionaryCount++;
#endif
        return newTypeHandler;
    }